

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O2

void Vta_ManUnsatCoreRemap(Vta_Man_t *p,Vec_Int_t *vCore)

{
  int i;
  Vta_Obj_t *pVVar1;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    if (vCore->nSize <= lVar2) {
      return;
    }
    i = Vec_IntEntry(vCore,(int)lVar2);
    pVVar1 = Vta_ManObj(p,i);
    if (vCore->nSize <= lVar2) break;
    vCore->pArray[lVar2] = pVVar1->iFrame << ((byte)p->nObjBits & 0x1f) | pVVar1->iObj;
    lVar2 = lVar2 + 1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

void Vta_ManUnsatCoreRemap( Vta_Man_t * p, Vec_Int_t * vCore )
{
    Vta_Obj_t * pThis;
    int i, Entry;
    Vec_IntForEachEntry( vCore, Entry, i )
    {
        pThis = Vta_ManObj( p, Entry );
        Entry = (pThis->iFrame << p->nObjBits) | pThis->iObj;
        Vec_IntWriteEntry( vCore, i, Entry );
    }
}